

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

DirHandle * getRealDirHandle(char *_fname)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined1 *ptr;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  ulong len_00;
  void *ptr_00;
  char *dst;
  undefined1 **ppuVar6;
  undefined1 *local_78;
  undefined1 local_70 [8];
  PHYSFS_Stat statbuf;
  char *arcfname;
  DirHandle *i;
  size_t len;
  char *fname;
  char *allocated_fname;
  DirHandle *retval;
  char *_fname_local;
  
  ppuVar6 = &local_78;
  allocated_fname = (char *)0x0;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local = (char *)0x0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    sVar5 = strlen(_fname);
    len_00 = sVar5 + longest_root + 1;
    if (len_00 < 0x100) {
      ppuVar6 = (undefined1 **)
                (local_70 + (-8 - (sVar5 + longest_root + 0x18 & 0xfffffffffffffff0)));
      local_78 = (undefined1 *)ppuVar6;
    }
    else {
      local_78 = (undefined1 *)0x0;
    }
    ptr = local_78;
    *(undefined8 *)((long)ppuVar6 + -8) = 0x109e82;
    ptr_00 = __PHYSFS_initSmallAlloc(ptr,len_00);
    if (ptr_00 == (void *)0x0) {
      *(undefined8 *)((long)ppuVar6 + -8) = 0x109e97;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      *(undefined8 *)((long)ppuVar6 + -8) = 0x109ea3;
      __PHYSFS_platformReleaseMutex(stateLock);
      _fname_local = (char *)0x0;
    }
    else {
      dst = (char *)((long)ptr_00 + longest_root);
      *(undefined8 *)((long)ppuVar6 + -8) = 0x109ece;
      iVar4 = sanitizePlatformIndependentPath(_fname,dst);
      if (iVar4 != 0) {
        for (arcfname = (char *)searchPath; arcfname != (char *)0x0;
            arcfname = *(char **)(arcfname + 0x30)) {
          statbuf._32_8_ = dst;
          *(undefined8 *)((long)ppuVar6 + -8) = 0x109efe;
          iVar4 = partOfMountPoint((DirHandle *)arcfname,dst);
          if (iVar4 != 0) {
            allocated_fname = arcfname;
            break;
          }
          *(undefined8 *)((long)ppuVar6 + -8) = 0x109f1c;
          iVar4 = verifyPath((DirHandle *)arcfname,(char **)&statbuf.filetype,0);
          uVar3 = statbuf._32_8_;
          if (iVar4 != 0) {
            pcVar1 = *(code **)(*(long *)(arcfname + 0x28) + 0x68);
            uVar2 = *(undefined8 *)arcfname;
            *(undefined8 *)((long)ppuVar6 + -8) = 0x109f3e;
            iVar4 = (*pcVar1)(uVar2,uVar3,local_70);
            if (iVar4 != 0) {
              allocated_fname = arcfname;
              break;
            }
          }
        }
      }
      *(undefined8 *)((long)ppuVar6 + -8) = 0x109f6f;
      __PHYSFS_platformReleaseMutex(stateLock);
      *(undefined8 *)((long)ppuVar6 + -8) = 0x109f78;
      __PHYSFS_smallFree(ptr_00);
      _fname_local = allocated_fname;
    }
  }
  return (DirHandle *)_fname_local;
}

Assistant:

static DirHandle *getRealDirHandle(const char *_fname)
{
    DirHandle *retval = NULL;
    char *allocated_fname = NULL;
    char *fname = NULL;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, NULL);

    __PHYSFS_platformGrabMutex(stateLock);
    len = strlen(_fname) + longest_root + 1;
    allocated_fname = __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, NULL);
    fname = allocated_fname + longest_root;
    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        DirHandle *i;
        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (partOfMountPoint(i, arcfname))
            {
                retval = i;
                break;
            } /* if */
            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    retval = i;
                    break;
                } /* if */
            } /* if */
        } /* for */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return retval;
}